

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O1

void __thiscall icu_63::Formattable::setString(Formattable *this,UnicodeString *stringToCopy)

{
  UnicodeString *pUVar1;
  
  pUVar1 = stringToCopy;
  dispose(this);
  this->fType = kString;
  pUVar1 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pUVar1);
  if (pUVar1 == (UnicodeString *)0x0) {
    pUVar1 = (UnicodeString *)0x0;
  }
  else {
    UnicodeString::UnicodeString(pUVar1,stringToCopy);
  }
  (this->fValue).fString = pUVar1;
  return;
}

Assistant:

void
Formattable::setString(const UnicodeString& stringToCopy)
{
    dispose();
    fType = kString;
    fValue.fString = new UnicodeString(stringToCopy);
}